

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalnull.c
# Opt level: O2

int ffpscl(fitsfile *fptr,double scale,double zero,int *status)

{
  FITSfile *pFVar1;
  tcolumn *ptVar2;
  int iVar3;
  int hdutype;
  int local_24;
  double local_20;
  double local_18;
  
  if (0 < *status) {
    return *status;
  }
  if ((scale != 0.0) || (NAN(scale))) {
    local_20 = scale;
    local_18 = zero;
    iVar3 = ffghdt(fptr,&local_24,status);
    if (iVar3 < 1) {
      if (local_24 != 0) {
        *status = 0xe9;
        return 0xe9;
      }
      iVar3 = fits_is_compressed_image(fptr,status);
      pFVar1 = fptr->Fptr;
      if (iVar3 == 0) {
        ptVar2 = pFVar1->tableptr;
        ptVar2[1].tscale = local_20;
        ptVar2[1].tzero = local_18;
      }
      else {
        pFVar1->cn_bscale = local_20;
        pFVar1->cn_bzero = local_18;
      }
    }
    iVar3 = *status;
  }
  else {
    *status = 0x142;
    iVar3 = 0x142;
  }
  return iVar3;
}

Assistant:

int ffpscl(fitsfile *fptr,      /* I - FITS file pointer               */
           double scale,        /* I - scaling factor: value of BSCALE */
           double zero,         /* I - zero point: value of BZERO      */
           int *status)         /* IO - error status                   */
/*
  Define the linear scaling factor for the primary array or image extension
  pixel values. This routine overrides the scaling values given by the
  BSCALE and BZERO keywords if present.  Note that this routine does not
  write or modify the BSCALE and BZERO keywords, but instead only modifies
  the values temporarily in the internal buffer.  Thus, a subsequent call to
  the ffrdef routine will reset the scaling back to the BSCALE and BZERO
  keyword values (or 1. and 0. respectively if the keywords are not present).
*/
{
    tcolumn *colptr;
    int hdutype;

    if (*status > 0)
        return(*status);

    if (scale == 0)
        return(*status = ZERO_SCALE);  /* zero scale value is illegal */

    if (ffghdt(fptr, &hdutype, status) > 0)  /* get HDU type */
        return(*status);

    if (hdutype != IMAGE_HDU)
        return(*status = NOT_IMAGE);         /* not proper HDU type */

    if (fits_is_compressed_image(fptr, status)) /* compressed images */
    {
        (fptr->Fptr)->cn_bscale = scale;
        (fptr->Fptr)->cn_bzero  = zero;
        return(*status);
    }

    /* set pointer to the first 'column' (contains group parameters if any) */
    colptr = (fptr->Fptr)->tableptr; 

    colptr++;   /* increment to the 2nd 'column' pointer  (the image itself) */

    colptr->tscale = scale;
    colptr->tzero = zero;

    return(*status);
}